

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::mouseReleaseEvent(QAbstractItemView *this,QMouseEvent *event)

{
  long lVar1;
  QAbstractItemViewPrivate *this_00;
  Data *pDVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  undefined4 uVar7;
  int iVar8;
  ulong uVar9;
  QStyle *pQVar10;
  long lVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  QModelIndex QStack_148;
  QModelIndex local_130;
  QPersistentModelIndex index;
  QStyleOptionViewItem option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  bVar5 = this_00->releaseFromDoubleClick;
  this_00->releaseFromDoubleClick = false;
  option.super_QStyleOption._0_16_ = QSinglePointEvent::position((QSinglePointEvent *)event);
  QPointF::toPoint((QPointF *)&option);
  index.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)this + 0x1f0))(&option,this);
  QPersistentModelIndex::QPersistentModelIndex(&index,(QModelIndex *)&option);
  if (*(int *)(*(long *)(this + 8) + 0x3a8) == 3) {
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&option,&index);
    if (((-1 < option.super_QStyleOption.version) && (-1 < option.super_QStyleOption.type)) &&
       ((QAbstractItemModel *)option.super_QStyleOption.rect._0_8_ == this_00->model)) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_130,&index);
      uVar9 = (**(code **)(*(long *)this_00->model + 0x138))(this_00->model,&local_130);
      if ((uVar9 & 0x20) != 0) {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&QStack_148,&index);
        bVar5 = QAbstractItemViewPrivate::sendDelegateEvent(this_00,&QStack_148,(QEvent *)event);
        if (bVar5) {
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&option,&index);
          update(this,(QModelIndex *)&option);
        }
      }
    }
    goto LAB_004e3995;
  }
  cVar6 = ::comparesEqual(&index,&this_00->pressedIndex);
  if (cVar6 == '\0') {
LAB_004e37fa:
    bVar5 = false;
LAB_004e37fd:
    bVar4 = bVar5;
    cVar6 = '\0';
  }
  else {
    cVar6 = QPersistentModelIndex::isValid();
    if ((cVar6 == '\0') || (bVar5 != false)) goto LAB_004e37fa;
    lVar11 = 0;
    if ((this_00->pressedAlreadySelected == true) && (*(int *)(event + 0x40) == 1)) {
      lVar11 = (ulong)(*(int *)(event + 0x20) == 0) << 2;
    }
    bVar4 = true;
    bVar5 = true;
    if (this_00->pressClosedEditor != false) goto LAB_004e37fd;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&option,&index);
    cVar6 = (**(code **)(*(long *)this + 0x2e0))(this,&option,lVar11,event);
  }
  this_00->ctrlDragSelectionFlag = NoUpdate;
  bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_00->selectionModel);
  if (((bVar5) && (this_00->noSelectionOnMousePress == true)) &&
     (this_00->noSelectionOnMousePress = false, this_00->pressClosedEditor == false)) {
    pDVar2 = (this_00->selectionModel).wp.d;
    if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
      pQVar12 = (QObject *)0x0;
    }
    else {
      pQVar12 = (this_00->selectionModel).wp.value;
    }
    QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&option,&index);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_130,&index);
    uVar7 = (**(code **)(*(long *)this + 0x2e8))(this,&local_130,event);
    (**(code **)(*(long *)pQVar12 + 0x68))(pQVar12,&option,uVar7);
  }
  this_00->pressClosedEditor = false;
  *(undefined4 *)(*(long *)(this + 8) + 0x3a8) = 0;
  if (bVar4) {
    if (*(int *)(event + 0x40) == 1) {
      QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&option,&index);
      clicked(this,(QModelIndex *)&option);
    }
    if (cVar6 == '\0') {
      memset(&option,0xaa,0xd0);
      QStyleOptionViewItem::QStyleOptionViewItem(&option);
      (**(code **)(*(long *)this + 0x2f8))(this,&option);
      if (this_00->pressedAlreadySelected == true) {
        option.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ =
             option.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i._1_1_ | 0x80;
      }
      pQVar3 = this_00->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_130,&index);
      uVar9 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,&local_130);
      if ((uVar9 & 0x20) != 0) {
        pQVar10 = QWidget::style((QWidget *)this);
        iVar8 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x3d,&option,this,0);
        if (iVar8 != 0) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_130,&index);
          activated(this,&local_130);
        }
      }
      QStyleOptionViewItem::~QStyleOptionViewItem(&option);
    }
  }
LAB_004e3995:
  QPersistentModelIndex::~QPersistentModelIndex(&index);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::mouseReleaseEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);
    const bool releaseFromDoubleClick = d->releaseFromDoubleClick;
    d->releaseFromDoubleClick = false;

    QPoint pos = event->position().toPoint();
    QPersistentModelIndex index = indexAt(pos);

    if (state() == EditingState) {
        if (d->isIndexValid(index)
            && d->isIndexEnabled(index)
            && d->sendDelegateEvent(index, event))
            update(index);
        return;
    }

    bool click = (index == d->pressedIndex && index.isValid() && !releaseFromDoubleClick);
    bool selectedClicked = click && d->pressedAlreadySelected
                        && (event->button() == Qt::LeftButton)
                        && (event->modifiers() == Qt::NoModifier);
    EditTrigger trigger = (selectedClicked ? SelectedClicked : NoEditTriggers);
    const bool edited = click && !d->pressClosedEditor ? edit(index, trigger, event) : false;

    d->ctrlDragSelectionFlag = QItemSelectionModel::NoUpdate;

    if (d->selectionModel && d->noSelectionOnMousePress) {
        d->noSelectionOnMousePress = false;
        if (!d->pressClosedEditor)
            d->selectionModel->select(index, selectionCommand(index, event));
    }

    d->pressClosedEditor = false;
    setState(NoState);

    if (click) {
        if (event->button() == Qt::LeftButton)
            emit clicked(index);
        if (edited)
            return;
        QStyleOptionViewItem option;
        initViewItemOption(&option);
        if (d->pressedAlreadySelected)
            option.state |= QStyle::State_Selected;
        if ((d->model->flags(index) & Qt::ItemIsEnabled)
            && style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, &option, this))
            emit activated(index);
    }
}